

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

void init_encode_rd_sb(AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,
                      SIMPLE_MOTION_DATA_TREE *sms_root,RD_STATS *rd_cost,int mi_row,int mi_col,
                      int gather_tpl_data)

{
  int iVar1;
  long in_RSI;
  AV1_COMP *in_RDI;
  RD_STATS *in_R8;
  bool bVar2;
  BLOCK_SIZE sb_size;
  int num_planes;
  int use_simple_motion_search;
  SPEED_FEATURES *sf;
  MACROBLOCK *x;
  TileInfo *tile_info;
  AV1_COMMON *cm;
  int in_stack_000000ac;
  int in_stack_000000b0;
  BLOCK_SIZE in_stack_000000b7;
  MACROBLOCK *in_stack_000000b8;
  AV1_COMP *in_stack_000000c0;
  int in_stack_000000f0;
  int in_stack_000000f4;
  ThreadData_conflict *in_stack_000000f8;
  AV1_COMP *in_stack_00000100;
  int in_stack_00000518;
  int in_stack_0000051c;
  SIMPLE_MOTION_DATA_TREE *in_stack_00000520;
  MACROBLOCK *in_stack_00000528;
  TileInfo *in_stack_00000530;
  AV1_COMP *in_stack_00000538;
  
  if (((((in_RDI->sf).part_sf.simple_motion_search_split != 0) ||
       ((in_RDI->sf).part_sf.simple_motion_search_prune_rect != 0)) ||
      ((in_RDI->sf).part_sf.simple_motion_search_early_term_none != 0)) ||
     (bVar2 = false, (in_RDI->sf).part_sf.ml_early_term_after_part_split_level != 0)) {
    iVar1 = frame_is_intra_only(&in_RDI->common);
    bVar2 = iVar1 == 0;
  }
  if (bVar2) {
    av1_init_simple_motion_search_mvs_for_sb
              (in_stack_00000538,in_stack_00000530,in_stack_00000528,in_stack_00000520,
               in_stack_0000051c,in_stack_00000518);
  }
  iVar1 = has_no_stats_stage(in_RDI);
  if (((iVar1 == 0) || ((in_RDI->oxcf).mode != '\x01')) ||
     ((in_RDI->oxcf).gf_cfg.lag_in_frames != 0)) {
    init_ref_frame_space(in_stack_00000100,in_stack_000000f8,in_stack_000000f4,in_stack_000000f0);
    *(undefined4 *)(in_RSI + 0x422c) = 0;
    *(undefined4 *)(in_RSI + 0x17208) = 0;
    if ((num_planes != 0) && ((in_RDI->common).delta_q_info.delta_q_present_flag != 0)) {
      av1_num_planes(&in_RDI->common);
      setup_delta_q((AV1_COMP *)cm,(ThreadData_conflict *)tile_info,x,(TileInfo *)sf,
                    use_simple_motion_search,num_planes,(int)rd_cost);
      av1_tpl_rdmult_setup_sb
                (in_stack_000000c0,in_stack_000000b8,in_stack_000000b7,in_stack_000000b0,
                 in_stack_000000ac);
    }
  }
  *(undefined1 *)(in_RSI + 0x1f6c2) = 0;
  *(undefined4 *)(in_RSI + 0x24dfc) = 0;
  reset_mb_rd_record(*(MB_RD_RECORD **)(in_RSI + 0x25610));
  memset((void *)(in_RSI + 0x16200),0,0x1000);
  av1_invalid_rd_stats(in_R8);
  return;
}

Assistant:

static inline void init_encode_rd_sb(AV1_COMP *cpi, ThreadData *td,
                                     const TileDataEnc *tile_data,
                                     SIMPLE_MOTION_DATA_TREE *sms_root,
                                     RD_STATS *rd_cost, int mi_row, int mi_col,
                                     int gather_tpl_data) {
  const AV1_COMMON *cm = &cpi->common;
  const TileInfo *tile_info = &tile_data->tile_info;
  MACROBLOCK *x = &td->mb;

  const SPEED_FEATURES *sf = &cpi->sf;
  const int use_simple_motion_search =
      (sf->part_sf.simple_motion_search_split ||
       sf->part_sf.simple_motion_search_prune_rect ||
       sf->part_sf.simple_motion_search_early_term_none ||
       sf->part_sf.ml_early_term_after_part_split_level) &&
      !frame_is_intra_only(cm);
  if (use_simple_motion_search) {
    av1_init_simple_motion_search_mvs_for_sb(cpi, tile_info, x, sms_root,
                                             mi_row, mi_col);
  }

#if !CONFIG_REALTIME_ONLY
  if (!(has_no_stats_stage(cpi) && cpi->oxcf.mode == REALTIME &&
        cpi->oxcf.gf_cfg.lag_in_frames == 0)) {
    init_ref_frame_space(cpi, td, mi_row, mi_col);
    x->sb_energy_level = 0;
    x->part_search_info.cnn_output_valid = 0;
    if (gather_tpl_data) {
      if (cm->delta_q_info.delta_q_present_flag) {
        const int num_planes = av1_num_planes(cm);
        const BLOCK_SIZE sb_size = cm->seq_params->sb_size;
        setup_delta_q(cpi, td, x, tile_info, mi_row, mi_col, num_planes);
        av1_tpl_rdmult_setup_sb(cpi, x, sb_size, mi_row, mi_col);
      }

      // TODO(jingning): revisit this function.
      if (cpi->oxcf.algo_cfg.enable_tpl_model && (0)) {
        adjust_rdmult_tpl_model(cpi, x, mi_row, mi_col);
      }
    }
  }
#else
  (void)tile_info;
  (void)mi_row;
  (void)mi_col;
  (void)gather_tpl_data;
#endif

  x->reuse_inter_pred = false;
  x->txfm_search_params.mode_eval_type = DEFAULT_EVAL;
  reset_mb_rd_record(x->txfm_search_info.mb_rd_record);
  av1_zero(x->picked_ref_frames_mask);
  av1_invalid_rd_stats(rd_cost);
}